

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall wasm::Wasm2JSBuilder::addTable(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  anon_class_16_2_20c246d3 visitor;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  pointer pTVar4;
  type table_00;
  Ref RVar5;
  Value *pVVar6;
  Ref in_RCX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar7;
  Ref in_R8;
  IString name_00;
  IString target;
  IString target_00;
  IString str;
  IString name_01;
  IString name_02;
  Ref theVar_1;
  IString local_458;
  Value *local_448;
  Ref table_1;
  Ref theVar;
  IString local_2a0;
  Value *local_290;
  Value *local_288;
  Value *local_280;
  Ref initial;
  Name local_238;
  IString *local_228;
  Name *name;
  iterator __end4;
  iterator __begin4;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range4;
  FlatTable flat;
  Fatal local_1d8;
  reference local_50;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *table;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *__range1;
  Ref theArray;
  bool perElementInit;
  Module *wasm_local;
  Wasm2JSBuilder *this_local;
  Ref ast_local;
  
  this_local = (Wasm2JSBuilder *)ast.inst;
  sVar3 = std::
          vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ::size(&wasm->tables);
  if (sVar3 != 0) {
    bVar1 = false;
    __range1 = (vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                *)cashew::ValueBuilder::makeArray();
    __end1 = std::
             vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ::begin(&wasm->tables);
    table = (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
            std::
            vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ::end(&wasm->tables);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                                       *)&table), bVar2) {
      local_50 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                 ::operator*(&__end1);
      pTVar4 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(local_50)
      ;
      bVar2 = wasm::Type::isFunction(&pTVar4->type);
      if (!bVar2) {
        Fatal::Fatal(&local_1d8);
        Fatal::operator<<(&local_1d8,(char (*) [45])"wasm2js doesn\'t support non-function tables\n"
                         );
        Fatal::~Fatal(&local_1d8);
      }
      pTVar4 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(local_50)
      ;
      bVar2 = Importable::imported(&pTVar4->super_Importable);
      if (bVar2) {
        bVar1 = true;
      }
      else {
        table_00 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator*
                             (local_50);
        TableUtils::FlatTable::FlatTable((FlatTable *)&__range4,wasm,table_00);
        if (((byte)flat.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage & 1) == 0) {
          bVar1 = true;
          pTVar4 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                             (local_50);
          local_280 = (Value *)cashew::ValueBuilder::makeInt((uint32_t)(pTVar4->initial).addr);
          IString::IString(&local_2a0,"Array");
          target.str._M_str = (char *)local_280;
          target.str._M_len = (size_t)local_2a0.str._M_str;
          local_290 = (Value *)cashew::ValueBuilder::makeCall<cashew::Ref>
                                         ((ValueBuilder *)local_2a0.str._M_len,target,in_RCX);
          local_288 = (Value *)cashew::ValueBuilder::makeNew((Ref)local_290);
          __range1 = (vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                      *)local_288;
        }
        else {
          __end4 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin
                             ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range4);
          name = (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                                   ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range4);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                             *)&name), bVar2) {
            local_228 = &__gnu_cxx::
                         __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                         ::operator*(&__end4)->super_IString;
            bVar2 = IString::is(local_228);
            if (bVar2) {
              str = fromName(this,local_228->str,Top);
              in_RCX.inst = (Value *)str.str._M_len;
              wasm::Name::Name(&local_238,str);
              wasm::Name::operator=((Name *)local_228,&local_238);
              pcVar7 = extraout_RDX;
            }
            else {
              wasm::Name::operator=((Name *)local_228,(Name *)&NULL_);
              pcVar7 = extraout_RDX_00;
            }
            initial.inst = (Value *)(local_228->str)._M_len;
            name_00.str._M_str = pcVar7;
            name_00.str._M_len = (size_t)(local_228->str)._M_str;
            RVar5 = cashew::ValueBuilder::makeName((ValueBuilder *)initial.inst,name_00);
            cashew::ValueBuilder::appendToArray((Ref)__range1,RVar5);
            __gnu_cxx::
            __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
            operator++(&__end4);
          }
        }
        TableUtils::FlatTable::~FlatTable((FlatTable *)&__range4);
      }
      bVar2 = isTableExported(wasm);
      if (bVar2) {
        pTVar4 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                           (local_50);
        bVar2 = Importable::imported(&pTVar4->super_Importable);
        if (bVar2) {
          Fatal::Fatal((Fatal *)&theVar);
          Fatal::operator<<((Fatal *)&theVar,
                            (char (*) [68])
                            "wasm2js doesn\'t support a table that is both imported and exported\n")
          ;
          Fatal::~Fatal((Fatal *)&theVar);
        }
        RVar5 = cashew::ValueBuilder::makeVar(false);
        pVVar6 = cashew::Ref::operator->((Ref *)&this_local);
        table_1.inst = RVar5.inst;
        cashew::Value::push_back(pVVar6,RVar5);
        IString::IString(&local_458,"Table");
        target_00.str._M_str = (char *)__range1;
        target_00.str._M_len = (size_t)local_458.str._M_str;
        in_RCX = cashew::ValueBuilder::makeCall<cashew::Ref>
                           ((ValueBuilder *)local_458.str._M_len,target_00,in_RCX);
        name_01.str._M_str = (char *)in_RCX.inst;
        name_01.str._M_len = DAT_03192d68;
        local_448 = in_RCX.inst;
        cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar5.inst,FUNCTION_TABLE,name_01,in_R8);
      }
      else {
        pTVar4 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                           (local_50);
        bVar2 = Importable::imported(&pTVar4->super_Importable);
        if (!bVar2) {
          RVar5 = cashew::ValueBuilder::makeVar(false);
          pVVar6 = cashew::Ref::operator->((Ref *)&this_local);
          cashew::Value::push_back(pVVar6,RVar5);
          name_02.str._M_str = (char *)__range1;
          name_02.str._M_len = DAT_03192d68;
          in_RCX.inst = (Value *)__range1;
          cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar5.inst,FUNCTION_TABLE,name_02,in_R8)
          ;
        }
      }
      if (bVar1) {
        pTVar4 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                           (local_50);
        in_RCX.inst = (Value *)&this_local;
        visitor.this = this;
        visitor.ast = (Ref *)in_RCX.inst;
        in_R8.inst = (Value *)this;
        wasm::ModuleUtils::
        iterTableSegments<wasm::Wasm2JSBuilder::addTable(cashew::Ref,wasm::Module*)::__0>
                  (wasm,(Name)(pTVar4->super_Importable).super_Named.name.super_IString.str,visitor)
        ;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void Wasm2JSBuilder::addTable(Ref ast, Module* wasm) {
  if (wasm->tables.size() == 0) {
    return;
  }

  bool perElementInit = false;

  // Emit a simple flat table as a JS array literal. Otherwise,
  // emit assignments separately for each index.
  Ref theArray = ValueBuilder::makeArray();
  for (auto& table : wasm->tables) {
    if (!table->type.isFunction()) {
      Fatal() << "wasm2js doesn't support non-function tables\n";
    }

    if (!table->imported()) {
      TableUtils::FlatTable flat(*wasm, *table);
      if (flat.valid) {
        for (auto& name : flat.names) {
          if (name.is()) {
            name = fromName(name, NameScope::Top);
          } else {
            name = NULL_;
          }
          ValueBuilder::appendToArray(theArray, ValueBuilder::makeName(name));
        }
      } else {
        perElementInit = true;
        Ref initial =
          ValueBuilder::makeInt(Address::address32_t(table->initial.addr));
        theArray = ValueBuilder::makeNew(
          ValueBuilder::makeCall(IString("Array"), initial));
      }
    } else {
      perElementInit = true;
    }

    if (isTableExported(*wasm)) {
      // If the table is exported use a fake WebAssembly.Table object
      // We don't handle the case where a table is both imported and exported.
      if (table->imported()) {
        Fatal() << "wasm2js doesn't support a table that is both imported and "
                   "exported\n";
      }
      Ref theVar = ValueBuilder::makeVar();
      ast->push_back(theVar);

      Ref table = ValueBuilder::makeCall(IString("Table"), theArray);
      ValueBuilder::appendToVar(theVar, FUNCTION_TABLE, table);
    } else if (!table->imported()) {
      // Otherwise if the table is internal (neither imported not exported).
      // Just use a plain array in this case, avoiding the Table.
      Ref theVar = ValueBuilder::makeVar();
      ast->push_back(theVar);
      ValueBuilder::appendToVar(theVar, FUNCTION_TABLE, theArray);
    }

    if (perElementInit) {
      // TODO: optimize for size
      ModuleUtils::iterTableSegments(
        *wasm, table->name, [&](ElementSegment* segment) {
          auto offset = segment->offset;
          ElementUtils::iterElementSegmentFunctionNames(
            segment, [&](Name entry, Index i) {
              Ref index;
              if (auto* c = offset->dynCast<Const>()) {
                index = ValueBuilder::makeInt(c->value.geti32() + i);
              } else if (auto* get = offset->dynCast<GlobalGet>()) {
                index = ValueBuilder::makeBinary(
                  ValueBuilder::makeName(
                    stringToIString(asmangle(get->name.toString()))),
                  PLUS,
                  ValueBuilder::makeNum(i));
              } else {
                WASM_UNREACHABLE("unexpected expr type");
              }
              ast->push_back(
                ValueBuilder::makeStatement(ValueBuilder::makeBinary(
                  ValueBuilder::makeSub(ValueBuilder::makeName(FUNCTION_TABLE),
                                        index),
                  SET,
                  ValueBuilder::makeName(fromName(entry, NameScope::Top)))));
            });
        });
    }
  }
}